

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *
wasm::HeapTypeGenerator::makeInhabitable
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  bool bVar1;
  reference pHVar2;
  type *this;
  pointer ppVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference __x;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  pVar8;
  ulong local_1b8;
  size_t i;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_1a8;
  undefined1 local_190 [8];
  Inhabitator inhabitator;
  type_conflict *inserted;
  type *it;
  size_type local_e0;
  pair<const_wasm::HeapType,_unsigned_long> local_d8;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  local_c8;
  value_type_conflict2 local_b8 [3];
  HeapType local_a0;
  HeapType type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> deduplicated;
  vector<unsigned_long,_std::allocator<unsigned_long>_> deduplicatedIndices;
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  typeIndices;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *result;
  
  bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(types);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(__return_storage_ptr__);
  }
  else {
    std::
    unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
    ::unordered_map((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                     *)&deduplicatedIndices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1);
    __end1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(types);
    type.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(types);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                       *)&type), bVar1) {
      pHVar2 = __gnu_cxx::
               __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end1);
      local_a0.id = pHVar2->id;
      bVar1 = HeapType::isBasic(&local_a0);
      if (bVar1) {
        local_b8[0] = 0xffffffffffffffff;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_b8);
      }
      else {
        local_e0 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1);
        std::pair<const_wasm::HeapType,_unsigned_long>::pair<wasm::HeapType_&,_unsigned_long,_true>
                  (&local_d8,&local_a0,&local_e0);
        pVar8 = std::
                unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                ::insert((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                          *)&deduplicatedIndices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d8);
        local_c8.first =
             pVar8.first.
             super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>._M_cur;
        local_c8.second = pVar8.second;
        this = std::
               get<0ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,unsigned_long>,false,true>,bool>
                         (&local_c8);
        inhabitator.subtypes.typeSubTypes._M_h._M_single_bucket =
             (__node_base_ptr)
             std::
             get<1ul,std::__detail::_Node_iterator<std::pair<wasm::HeapType_const,unsigned_long>,false,true>,bool>
                       (&local_c8);
        if (((ulong)(inhabitator.subtypes.typeSubTypes._M_h._M_single_bucket)->_M_nxt & 1) != 0) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1,&local_a0)
          ;
        }
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>::
                 operator->(this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar3->second);
      }
      __gnu_cxx::
      __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end1);
    }
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &deduplicated.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(types);
    if (sVar4 != sVar5) {
      __assert_fail("deduplicatedIndices.size() == types.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                    ,0x3ea,
                    "static std::vector<HeapType> wasm::HeapTypeGenerator::makeInhabitable(const std::vector<HeapType> &)"
                   );
    }
    anon_unknown_24::Inhabitator::Inhabitator
              ((Inhabitator *)local_190,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1);
    anon_unknown_24::Inhabitator::markBottomRefsNullable((Inhabitator *)local_190);
    anon_unknown_24::Inhabitator::markExternRefsNullable((Inhabitator *)local_190);
    anon_unknown_24::Inhabitator::breakNonNullableCycles((Inhabitator *)local_190);
    anon_unknown_24::Inhabitator::build(&local_1a8,(Inhabitator *)local_190);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1,&local_1a8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_1a8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(__return_storage_ptr__);
    for (local_1b8 = 0;
        sVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(types),
        local_1b8 < sVar4; local_1b8 = local_1b8 + 1) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &deduplicated.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,local_1b8);
      if (*pvVar6 == 0xffffffffffffffff) {
        pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           (types,local_1b8);
        bVar1 = HeapType::isBasic(pvVar7);
        if (!bVar1) {
          __assert_fail("types[i].isBasic()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                        ,0x3f7,
                        "static std::vector<HeapType> wasm::HeapTypeGenerator::makeInhabitable(const std::vector<HeapType> &)"
                       );
        }
        pvVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           (types,local_1b8);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  (__return_storage_ptr__,pvVar7);
      }
      else {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &deduplicated.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,local_1b8);
        __x = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1,
                         *pvVar6);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                  (__return_storage_ptr__,__x);
      }
    }
    anon_unknown_24::Inhabitator::~Inhabitator((Inhabitator *)local_190);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&__range1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                      *)&deduplicatedIndices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType>
HeapTypeGenerator::makeInhabitable(const std::vector<HeapType>& types) {
  if (types.empty()) {
    return {};
  }

  // Remove duplicate and basic types. We will insert them back at the end.
  std::unordered_map<HeapType, size_t> typeIndices;
  std::vector<size_t> deduplicatedIndices;
  std::vector<HeapType> deduplicated;
  for (auto type : types) {
    if (type.isBasic()) {
      deduplicatedIndices.push_back(-1);
      continue;
    }
    auto [it, inserted] = typeIndices.insert({type, deduplicated.size()});
    if (inserted) {
      deduplicated.push_back(type);
    }
    deduplicatedIndices.push_back(it->second);
  }
  assert(deduplicatedIndices.size() == types.size());

  // Construct the new types.
  Inhabitator inhabitator(deduplicated);
  inhabitator.markBottomRefsNullable();
  inhabitator.markExternRefsNullable();
  inhabitator.breakNonNullableCycles();
  deduplicated = inhabitator.build();

  // Re-duplicate and re-insert basic types as necessary.
  std::vector<HeapType> result;
  for (size_t i = 0; i < types.size(); ++i) {
    if (deduplicatedIndices[i] == (size_t)-1) {
      assert(types[i].isBasic());
      result.push_back(types[i]);
    } else {
      result.push_back(deduplicated[deduplicatedIndices[i]]);
    }
  }
  return result;
}